

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall randomx::Instruction::h_FADD_M(Instruction *this,ostream *os)

{
  byte bVar1;
  byte bVar2;
  ostream *poVar3;
  
  bVar1 = this->dst;
  bVar2 = this->src;
  poVar3 = std::operator<<(os,"f");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1 & 3);
  std::operator<<(poVar3,", ");
  genAddressReg(this,os,bVar2 & 7);
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

void Instruction::h_FADD_M(std::ostream& os) const {
		auto dstIndex = dst % RegisterCountFlt;
		auto srcIndex = src % RegistersCount;
		os << "f" << dstIndex << ", ";
		genAddressReg(os, srcIndex);
		os << std::endl;
	}